

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O1

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributesToOriginalFormat(KdTreeAttributesDecoder *this)

{
  byte bVar1;
  DataType DVar2;
  PointAttribute *this_00;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> src_att;
  DracoOptions<draco::GeometryAttribute::Type> *this_01;
  long lVar3;
  pointer pAVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  vector<int,_std::allocator<int>_> signed_val;
  int local_b0;
  allocator_type local_a9;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_a8;
  string local_a0;
  uint local_7c;
  pointer local_78;
  Type local_70;
  undefined4 uStack_6c;
  long local_60;
  KdTreeAttributesDecoder *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (((this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar5 = true;
  }
  else {
    iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[6])(this);
    bVar5 = iVar6 < 1;
    if (0 < iVar6) {
      uVar9 = 0;
      local_b0 = 0;
      uVar10 = 0;
      local_58 = this;
      do {
        iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[5])(this,(ulong)uVar10);
        iVar7 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        this_00 = *(PointAttribute **)
                   (*(long *)(*(long *)(CONCAT44(extraout_var,iVar7) + 8) + 0x10) + (long)iVar6 * 8)
        ;
        local_7c = uVar10;
        switch((this_00->super_GeometryAttribute).data_type_) {
        case DT_INT8:
        case DT_INT16:
        case DT_INT32:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,
                     (ulong)(this_00->super_GeometryAttribute).num_components_,
                     (allocator_type *)&local_70);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_70,
                     (ulong)(this_00->super_GeometryAttribute).num_components_,&local_a9);
          DVar2 = (this_00->super_GeometryAttribute).data_type_;
          if (DVar2 == DT_INT8) {
            bVar5 = TransformAttributeBackToSignedType<signed_char>(this,this_00,local_b0);
LAB_00156ffb:
            if (bVar5 != false) goto LAB_00156fff;
            bVar5 = false;
          }
          else {
            if (DVar2 == DT_INT16) {
              bVar5 = TransformAttributeBackToSignedType<short>(this,this_00,local_b0);
              goto LAB_00156ffb;
            }
            if (DVar2 == DT_INT32) {
              bVar5 = TransformAttributeBackToSignedType<int>(this,this_00,local_b0);
              goto LAB_00156ffb;
            }
LAB_00156fff:
            local_b0 = local_b0 + (uint)(this_00->super_GeometryAttribute).num_components_;
            bVar5 = true;
          }
          pvVar8 = (void *)CONCAT44(uStack_6c,local_70);
          if (pvVar8 != (void *)0x0) {
            operator_delete(pvVar8,local_60 - (long)pvVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_a0._M_dataplus._M_p,
                            local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p
                           );
          }
          uVar10 = 1;
          if (bVar5) goto switchD_00156ed5_caseD_2;
          break;
        case DT_FLOAT32:
          src_att._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (this->quantized_portable_attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar9]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          local_78 = (this->attribute_quantization_transforms_).
                     super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)uVar9;
          local_50 = uVar9;
          iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[7])(this);
          this_01 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                     (CONCAT44(extraout_var_00,iVar6) + 0x50);
          local_70 = (this_00->super_GeometryAttribute).attribute_type_;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"skip_attribute_transform","");
          bVar5 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                            (this_01,&local_70,&local_a0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          pAVar4 = local_78;
          if (bVar5) {
            PointAttribute::CopyFrom
                      (this_00,(PointAttribute *)
                               src_att._M_t.
                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
            uVar10 = 4;
          }
          else {
            local_a8._M_head_impl._0_4_ = local_78->quantization_bits_;
            bVar1 = (this_00->super_GeometryAttribute).num_components_;
            local_38 = (ulong)((uint)bVar1 * 4);
            pvVar8 = operator_new__(local_38);
            Dequantizer::Dequantizer((Dequantizer *)&local_a0);
            bVar5 = Dequantizer::Init((Dequantizer *)&local_a0,pAVar4->range_,
                                      ~(-1 << ((byte)local_a8._M_head_impl & 0x1f)));
            uVar10 = 1;
            if (bVar5) {
              if (*(ValueType *)
                   ((long)src_att._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x60
                   ) == 0) {
                uVar10 = 0;
              }
              else {
                local_48 = *(int64_t *)
                            ((long)src_att._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30) +
                           **(long **)src_att._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl;
                local_40 = (ulong)((uint)bVar1 * 4);
                lVar11 = 0;
                uVar10 = 0;
                iVar6 = 0;
                local_a8._M_head_impl =
                     (PointAttribute *)
                     src_att._M_t.
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
                do {
                  if ((ulong)bVar1 != 0) {
                    lVar3 = *(long *)&(local_78->min_values_).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data;
                    uVar9 = 0;
                    do {
                      *(float *)((long)pvVar8 + uVar9 * 4) =
                           (float)*(int *)(local_48 + (long)iVar6 * 4 + uVar9 * 4) *
                           local_a0._M_dataplus._M_p._0_4_ + *(float *)(lVar3 + uVar9 * 4);
                      uVar9 = uVar9 + 1;
                    } while (bVar1 != uVar9);
                    iVar6 = iVar6 + (int)uVar9;
                  }
                  memcpy((void *)(*(long *)&(((this_00->attribute_buffer_)._M_t.
                                              super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                              .super__Head_base<0UL,_draco::DataBuffer_*,_false>.
                                             _M_head_impl)->data_).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                 + lVar11),pvVar8,local_38);
                  lVar11 = lVar11 + local_40;
                  uVar10 = uVar10 + 1;
                } while (uVar10 < *(ValueType *)((long)local_a8._M_head_impl + 0x60));
                uVar10 = 0;
              }
            }
            operator_delete__(pvVar8);
            this = local_58;
          }
          uVar9 = (ulong)((int)local_50 + 1);
          if (uVar10 != 0) break;
        default:
switchD_00156ed5_caseD_2:
          uVar10 = 0;
        }
        if ((uVar10 & 3) != 0) {
          return false;
        }
        uVar10 = local_7c + 1;
        iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[6])(this);
        bVar5 = iVar6 <= (int)uVar10;
      } while ((int)uVar10 < iVar6);
    }
  }
  return bVar5;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributesToOriginalFormat() {
  if (quantized_portable_attributes_.empty() && min_signed_values_.empty()) {
    return true;
  }
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Dequantize attributes that needed it.
  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
        att->data_type() == DT_INT8) {
      std::vector<uint32_t> unsigned_val(att->num_components());
      std::vector<int32_t> signed_val(att->num_components());
      // Values are stored as unsigned in the attribute, make them signed again.
      if (att->data_type() == DT_INT32) {
        if (!TransformAttributeBackToSignedType<int32_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT16) {
        if (!TransformAttributeBackToSignedType<int16_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT8) {
        if (!TransformAttributeBackToSignedType<int8_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      }
      num_processed_signed_components += att->num_components();
    } else if (att->data_type() == DT_FLOAT32) {
      // TODO(ostava): This code should be probably moved out to attribute
      // transform and shared with the SequentialQuantizationAttributeDecoder.

      const PointAttribute *const src_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();

      const AttributeQuantizationTransform &transform =
          attribute_quantization_transforms_
              [num_processed_quantized_attributes];

      num_processed_quantized_attributes++;

      if (GetDecoder()->options()->GetAttributeBool(
              att->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        att->CopyFrom(*src_att);
        continue;
      }

      // Convert all quantized values back to floats.
      const int32_t max_quantized_value =
          (1u << static_cast<uint32_t>(transform.quantization_bits())) - 1;
      const int num_components = att->num_components();
      const int entry_size = sizeof(float) * num_components;
      const std::unique_ptr<float[]> att_val(new float[num_components]);
      int quant_val_id = 0;
      int out_byte_pos = 0;
      Dequantizer dequantizer;
      if (!dequantizer.Init(transform.range(), max_quantized_value)) {
        return false;
      }
      const uint32_t *const portable_attribute_data =
          reinterpret_cast<const uint32_t *>(
              src_att->GetAddress(AttributeValueIndex(0)));
      for (uint32_t i = 0; i < src_att->size(); ++i) {
        for (int c = 0; c < num_components; ++c) {
          float value = dequantizer.DequantizeFloat(
              portable_attribute_data[quant_val_id++]);
          value = value + transform.min_value(c);
          att_val[c] = value;
        }
        // Store the floating point value into the attribute buffer.
        att->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
        out_byte_pos += entry_size;
      }
    }
  }
  return true;
}